

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

int __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  PackSnorm4x8Case *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  PackUnorm4x8Case *this_01;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  PackSnorm2x16Case *this_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  PackUnorm2x16Case *this_03;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  TestNode *pTVar1;
  undefined8 extraout_RAX_07;
  undefined8 extraout_RAX_08;
  int prec;
  Precision PVar2;
  long lVar3;
  
  PVar2 = PRECISION_MEDIUMP;
  while( true ) {
    lVar3 = 0;
    if (PVar2 == PRECISION_LAST) break;
    for (; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      this_00 = (PackSnorm4x8Case *)operator_new(0xf0);
      PackSnorm4x8Case::PackSnorm4x8Case
                (this_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_009f5d80 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      in_RAX = extraout_RAX;
    }
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  }
  for (; lVar3 != 0x18; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackSnorm4x8Case::UnpackSnorm4x8Case
              ((UnpackSnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5d80 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_00;
  }
  PVar2 = PRECISION_MEDIUMP;
  while( true ) {
    lVar3 = 0;
    if (PVar2 == PRECISION_LAST) break;
    for (; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      this_01 = (PackUnorm4x8Case *)operator_new(0xf0);
      PackUnorm4x8Case::PackUnorm4x8Case
                (this_01,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_009f5d80 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
      in_RAX = extraout_RAX_01;
    }
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  }
  for (; lVar3 != 0x18; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackUnorm4x8Case::UnpackUnorm4x8Case
              ((UnpackUnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5d80 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_02;
  }
  PVar2 = PRECISION_MEDIUMP;
  while( true ) {
    lVar3 = 0;
    if (PVar2 == PRECISION_LAST) break;
    for (; lVar3 != 8; lVar3 = lVar3 + 4) {
      this_02 = (PackSnorm2x16Case *)operator_new(0xf0);
      PackSnorm2x16Case::PackSnorm2x16Case
                (this_02,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_009f5e00 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
      in_RAX = extraout_RAX_03;
    }
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  }
  for (; lVar3 != 8; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackSnorm2x16Case::UnpackSnorm2x16Case
              ((UnpackSnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5e00 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_04;
  }
  PVar2 = PRECISION_MEDIUMP;
  while( true ) {
    lVar3 = 0;
    if (PVar2 == PRECISION_LAST) break;
    for (; lVar3 != 8; lVar3 = lVar3 + 4) {
      this_03 = (PackUnorm2x16Case *)operator_new(0xf0);
      PackUnorm2x16Case::PackUnorm2x16Case
                (this_03,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_009f5e00 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      in_RAX = extraout_RAX_05;
    }
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  }
  for (; lVar3 != 8; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackUnorm2x16Case::UnpackUnorm2x16Case
              ((UnpackUnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5e00 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_06;
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    PackHalf2x16Case::PackHalf2x16Case
              ((PackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5e00 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_07;
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackHalf2x16Case::UnpackHalf2x16Case
              ((UnpackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_009f5e00 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    in_RAX = extraout_RAX_08;
  }
  return (int)in_RAX;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	// New built-in functions in GLES 3.1
	{
		const glu::ShaderType allShaderTypes[] =
		{
			glu::SHADERTYPE_VERTEX,
			glu::SHADERTYPE_TESSELLATION_CONTROL,
			glu::SHADERTYPE_TESSELLATION_EVALUATION,
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_FRAGMENT,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));

		// packUnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));
	}

	// GLES 3 functions in new shader types.
	{
		const glu::ShaderType newShaderTypes[] =
		{
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packUnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new PackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// unpackHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));
	}
}